

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O1

void __thiscall
duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,TableFunction *function)

{
  named_parameter_type_map_t *this_00;
  __alloc_node_gen_t __alloc_node_gen;
  CreateTableFunctionInfo info;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
  local_3a8;
  TableFunction local_3a0;
  CreateTableFunctionInfo local_1e8;
  
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_3a0,(SimpleFunction *)function);
  local_3a0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__SimpleNamedParameterFunction_0248aa58;
  this_00 = &local_3a0.super_SimpleNamedParameterFunction.named_parameters;
  local_3a0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_buckets = (__buckets_ptr)0x0
  ;
  local_3a0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count =
       (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_bucket_count;
  local_3a0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  local_3a0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count =
       (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_element_count;
  local_3a0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
  _M_max_load_factor =
       (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_3a0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_ =
       *(undefined4 *)
        &(function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
         field_0x4;
  local_3a0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._M_next_resize
       = (function->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
         _M_next_resize;
  local_3a0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  local_3a8._M_h = (__hashtable_alloc *)this_00;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this_00,&(function->super_SimpleNamedParameterFunction).named_parameters._M_h,
             &local_3a8);
  local_3a0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_0247fa60;
  switchD_012e1ce8::default(&local_3a0.bind,&function->bind,0xd6);
  local_3a0.function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (function->function_info).internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_3a0.function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (function->function_info).internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (function->function_info).internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (function->function_info).internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_3a0.global_initialization = function->global_initialization;
  CreateTableFunctionInfo::CreateTableFunctionInfo(&local_1e8,&local_3a0);
  local_3a0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_0247fa60;
  if (local_3a0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a0.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_3a0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__SimpleNamedParameterFunction_0248aa58;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  SimpleFunction::~SimpleFunction((SimpleFunction *)&local_3a0);
  local_1e8.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreateTableFunction(this->catalog,this->transaction,&local_1e8);
  local_1e8.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateTableFunctionInfo_02485b78;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_1e8.functions.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.functions.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_1e8.functions.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_1e8.functions.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus.
                    _M_p);
  }
  local_1e8.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateFunctionInfo_024860c0;
  ::std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (&local_1e8.super_CreateFunctionInfo.descriptions.
              super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.super_CreateFunctionInfo.alias_of._M_dataplus._M_p !=
      &local_1e8.super_CreateFunctionInfo.alias_of.field_2) {
    operator_delete(local_1e8.super_CreateFunctionInfo.alias_of._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.super_CreateFunctionInfo.name._M_dataplus._M_p !=
      &local_1e8.super_CreateFunctionInfo.name.field_2) {
    operator_delete(local_1e8.super_CreateFunctionInfo.name._M_dataplus._M_p);
  }
  CreateInfo::~CreateInfo((CreateInfo *)&local_1e8);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(TableFunction function) {
	CreateTableFunctionInfo info(std::move(function));
	info.internal = true;
	catalog.CreateTableFunction(transaction, info);
}